

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::detail::WriteFloat<double>(ostringstream *str,double *arg,char mod)

{
  exception *this;
  char mod_local;
  double *arg_local;
  ostringstream *str_local;
  
  if (mod != '\0') {
    if (mod == '?') {
      WriteAnyFloat<double>((ostream *)str,*arg);
      return;
    }
    if (mod == 'L') {
      Write<long_double,double>((ostream *)str,arg);
      return;
    }
    if (mod != 'l') {
      this = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this);
      __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
    }
  }
  Write<double,double>((ostream *)str,arg);
  return;
}

Assistant:

void WriteFloat(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 0:
	case 'l': Write<double>(str, arg); break;
	case 'L': Write<long double>(str, arg); break;
	case '?': WriteAnyFloat(str, arg); break;
	default: throw std::exception(); break;
	}
}